

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::DecimalQuantity::getUpperDisplayMagnitude(DecimalQuantity *this)

{
  int local_28;
  int local_24;
  int32_t result;
  int32_t magnitude;
  DecimalQuantity *this_local;
  
  local_28 = this->scale + this->precision;
  if (local_28 < this->lReqPos) {
    local_24 = this->lReqPos;
  }
  else {
    if (this->lOptPos < local_28) {
      local_28 = this->lOptPos;
    }
    local_24 = local_28;
  }
  return local_24 + -1;
}

Assistant:

int32_t DecimalQuantity::getUpperDisplayMagnitude() const {
    // If this assertion fails, you need to call roundToInfinity() or some other rounding method.
    // See the comment in the header file explaining the "isApproximate" field.
    U_ASSERT(!isApproximate);

    int32_t magnitude = scale + precision;
    int32_t result = (lReqPos > magnitude) ? lReqPos : (lOptPos < magnitude) ? lOptPos : magnitude;
    return result - 1;
}